

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::LSTMWeightParams::SharedDtor(LSTMWeightParams *this)

{
  if (this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    if (this->inputgateweightmatrix_ != (WeightParams *)0x0) {
      (*(this->inputgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->forgetgateweightmatrix_ != (WeightParams *)0x0) {
      (*(this->forgetgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->blockinputweightmatrix_ != (WeightParams *)0x0) {
      (*(this->blockinputweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->outputgateweightmatrix_ != (WeightParams *)0x0) {
      (*(this->outputgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->inputgaterecursionmatrix_ != (WeightParams *)0x0) {
      (*(this->inputgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->forgetgaterecursionmatrix_ != (WeightParams *)0x0) {
      (*(this->forgetgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->blockinputrecursionmatrix_ != (WeightParams *)0x0) {
      (*(this->blockinputrecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->outputgaterecursionmatrix_ != (WeightParams *)0x0) {
      (*(this->outputgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->inputgatebiasvector_ != (WeightParams *)0x0) {
      (*(this->inputgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->forgetgatebiasvector_ != (WeightParams *)0x0) {
      (*(this->forgetgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->blockinputbiasvector_ != (WeightParams *)0x0) {
      (*(this->blockinputbiasvector_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->outputgatebiasvector_ != (WeightParams *)0x0) {
      (*(this->outputgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->inputgatepeepholevector_ != (WeightParams *)0x0) {
      (*(this->inputgatepeepholevector_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->forgetgatepeepholevector_ != (WeightParams *)0x0) {
      (*(this->forgetgatepeepholevector_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->outputgatepeepholevector_ != (WeightParams *)0x0) {
      (*(this->outputgatepeepholevector_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void LSTMWeightParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete inputgateweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete forgetgateweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete blockinputweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete outputgateweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete inputgaterecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete forgetgaterecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete blockinputrecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete outputgaterecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete inputgatebiasvector_;
  }
  if (this != internal_default_instance()) {
    delete forgetgatebiasvector_;
  }
  if (this != internal_default_instance()) {
    delete blockinputbiasvector_;
  }
  if (this != internal_default_instance()) {
    delete outputgatebiasvector_;
  }
  if (this != internal_default_instance()) {
    delete inputgatepeepholevector_;
  }
  if (this != internal_default_instance()) {
    delete forgetgatepeepholevector_;
  }
  if (this != internal_default_instance()) {
    delete outputgatepeepholevector_;
  }
}